

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdUtils.cpp
# Opt level: O0

uint32 Js::SIMDUtils::SimdOpcodeAsIndex(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  OpCode OVar4;
  undefined4 *puVar5;
  uint local_c;
  OpCode op_local;
  
  if (op < Simd128_Start_Extend) {
    OVar3 = Js::operator-(op,Simd128_Start);
    local_c = (uint)OVar3;
  }
  else {
    if ((op < Simd128_Start_Extend) || (Simd128_End_Extend < op)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SimdUtils.cpp"
                                  ,0x77,
                                  "(op >= Js::OpCode::Simd128_Start_Extend && op <= Js::OpCode::Simd128_End_Extend)"
                                  ,
                                  "op >= Js::OpCode::Simd128_Start_Extend && op <= Js::OpCode::Simd128_End_Extend"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    OVar3 = Js::operator-(op,Simd128_Start_Extend);
    OVar4 = Js::operator-(Simd128_End,Simd128_Start);
    local_c = (uint)OVar3 + (uint)OVar4 + 1;
  }
  return local_c;
}

Assistant:

uint32 SIMDUtils::SimdOpcodeAsIndex(Js::OpCode op)
    {
        if (op <= Js::OpCode::Simd128_End)
        {
            return (uint32)((Js::OpCode)op - Js::OpCode::Simd128_Start);
        }
        else
        {
            Assert(op >= Js::OpCode::Simd128_Start_Extend && op <= Js::OpCode::Simd128_End_Extend);
            return (uint32)((Js::OpCode)op - Js::OpCode::Simd128_Start_Extend) + (uint32)(Js::OpCode::Simd128_End - Js::OpCode::Simd128_Start) + 1;
        }
    }